

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O0

bool __thiscall
icu_63::double_conversion::DoubleStrtod
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *result)

{
  int iVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  int remaining_digits;
  undefined1 local_34 [4];
  double *pdStack_30;
  int read_digits;
  double *result_local;
  undefined1 auStack_20 [4];
  int exponent_local;
  Vector<const_char> trimmed_local;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  trimmed_local.start_._0_4_ = (uint)trimmed.start_;
  result_local._4_4_ = trimmed.length_;
  pdStack_30 = number_of_read_digits;
  _auStack_20 = this;
  iVar1 = Vector<const_char>::length((Vector<const_char> *)auStack_20);
  if (iVar1 < 0x10) {
    if ((result_local._4_4_ < 0) && (-result_local._4_4_ < 0x17)) {
      buffer._8_8_ = local_34;
      buffer.start_ = (char *)(ulong)(uint)trimmed_local.start_;
      uVar3 = ReadUint64(_auStack_20,buffer,(int *)number_of_read_digits);
      auVar4._8_4_ = (int)(uVar3 >> 0x20);
      auVar4._0_8_ = uVar3;
      auVar4._12_4_ = 0x45300000;
      *pdStack_30 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      *pdStack_30 = *pdStack_30 / *(double *)(exact_powers_of_ten + (long)-result_local._4_4_ * 8);
      return true;
    }
    if ((-1 < result_local._4_4_) && (result_local._4_4_ < 0x17)) {
      buffer_00._8_8_ = local_34;
      buffer_00.start_ = (char *)(ulong)(uint)trimmed_local.start_;
      uVar3 = ReadUint64(_auStack_20,buffer_00,(int *)number_of_read_digits);
      auVar5._8_4_ = (int)(uVar3 >> 0x20);
      auVar5._0_8_ = uVar3;
      auVar5._12_4_ = 0x45300000;
      *pdStack_30 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      *pdStack_30 = *(double *)(exact_powers_of_ten + (long)result_local._4_4_ * 8) * *pdStack_30;
      return true;
    }
    uVar2 = Vector<const_char>::length((Vector<const_char> *)auStack_20);
    iVar1 = 0xf - uVar2;
    if ((-1 < result_local._4_4_) && (result_local._4_4_ - iVar1 < 0x17)) {
      buffer_01._8_8_ = local_34;
      buffer_01.start_ = (char *)(ulong)(uint)trimmed_local.start_;
      uVar3 = ReadUint64(_auStack_20,buffer_01,(int *)(ulong)uVar2);
      auVar6._8_4_ = (int)(uVar3 >> 0x20);
      auVar6._0_8_ = uVar3;
      auVar6._12_4_ = 0x45300000;
      *pdStack_30 = (auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      *pdStack_30 = *(double *)(exact_powers_of_ten + (long)iVar1 * 8) * *pdStack_30;
      *pdStack_30 = *(double *)(exact_powers_of_ten + (long)(result_local._4_4_ - iVar1) * 8) *
                    *pdStack_30;
      return true;
    }
  }
  return false;
}

Assistant:

static bool DoubleStrtod(Vector<const char> trimmed,
                         int exponent,
                         double* result) {
#if !defined(DOUBLE_CONVERSION_CORRECT_DOUBLE_OPERATIONS)
  // On x86 the floating-point stack can be 64 or 80 bits wide. If it is
  // 80 bits wide (as is the case on Linux) then double-rounding occurs and the
  // result is not accurate.
  // We know that Windows32 uses 64 bits and is therefore accurate.
  // Note that the ARM simulator is compiled for 32bits. It therefore exhibits
  // the same problem.
  return false;
#endif
  if (trimmed.length() <= kMaxExactDoubleIntegerDecimalDigits) {
    int read_digits;
    // The trimmed input fits into a double.
    // If the 10^exponent (resp. 10^-exponent) fits into a double too then we
    // can compute the result-double simply by multiplying (resp. dividing) the
    // two numbers.
    // This is possible because IEEE guarantees that floating-point operations
    // return the best possible approximation.
    if (exponent < 0 && -exponent < kExactPowersOfTenSize) {
      // 10^-exponent fits into a double.
      *result = static_cast<double>(ReadUint64(trimmed, &read_digits));
      ASSERT(read_digits == trimmed.length());
      *result /= exact_powers_of_ten[-exponent];
      return true;
    }
    if (0 <= exponent && exponent < kExactPowersOfTenSize) {
      // 10^exponent fits into a double.
      *result = static_cast<double>(ReadUint64(trimmed, &read_digits));
      ASSERT(read_digits == trimmed.length());
      *result *= exact_powers_of_ten[exponent];
      return true;
    }
    int remaining_digits =
        kMaxExactDoubleIntegerDecimalDigits - trimmed.length();
    if ((0 <= exponent) &&
        (exponent - remaining_digits < kExactPowersOfTenSize)) {
      // The trimmed string was short and we can multiply it with
      // 10^remaining_digits. As a result the remaining exponent now fits
      // into a double too.
      *result = static_cast<double>(ReadUint64(trimmed, &read_digits));
      ASSERT(read_digits == trimmed.length());
      *result *= exact_powers_of_ten[remaining_digits];
      *result *= exact_powers_of_ten[exponent - remaining_digits];
      return true;
    }
  }
  return false;
}